

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O0

SizeT ARMT_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  int iVar1;
  UInt32 src;
  UInt32 dest;
  SizeT i;
  int encoding_local;
  UInt32 ip_local;
  SizeT size_local;
  Byte *data_local;
  SizeT local_8;
  
  if (size < 4) {
    local_8 = 0;
  }
  else {
    for (i = 0; i <= size - 4; i = i + 2) {
      if (((data[i + 1] & 0xf8) == 0xf0) && ((data[i + 3] & 0xf8) == 0xf8)) {
        if (encoding == 0) {
          iVar1 = -(ip + 4 + (int)i);
        }
        else {
          iVar1 = ip + 4 + (int)i;
        }
        dest = iVar1 + ((data[i + 1] & 7) << 0x13 | (uint)data[i] << 0xb | (data[i + 3] & 7) << 8 |
                       (uint)data[i + 2]) * 2;
        data[i + 1] = (byte)(dest >> 0x14) & 7 | 0xf0;
        data[i] = (Byte)(dest >> 0xc);
        data[i + 3] = (byte)((dest >> 1) >> 8) & 7 | 0xf8;
        data[i + 2] = (Byte)(dest >> 1);
        i = i + 2;
      }
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

SizeT ARMT_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 4;
  for (i = 0; i <= size; i += 2)
  {
    if ((data[i + 1] & 0xF8) == 0xF0 &&
        (data[i + 3] & 0xF8) == 0xF8)
    {
      UInt32 dest;
      UInt32 src =
        (((UInt32)data[i + 1] & 0x7) << 19) |
        ((UInt32)data[i + 0] << 11) |
        (((UInt32)data[i + 3] & 0x7) << 8) |
        (data[i + 2]);
      
      src <<= 1;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 1;
      
      data[i + 1] = (Byte)(0xF0 | ((dest >> 19) & 0x7));
      data[i + 0] = (Byte)(dest >> 11);
      data[i + 3] = (Byte)(0xF8 | ((dest >> 8) & 0x7));
      data[i + 2] = (Byte)dest;
      i += 2;
    }
  }
  return i;
}